

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.cpp
# Opt level: O1

shared_ptr<Quad> __thiscall Quad::firstQuad(Quad *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double *in_RSI;
  double dVar5;
  shared_ptr<Quad> sVar6;
  
  dVar1 = in_RSI[2];
  dVar5 = dVar1 * 0.25;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  this->xMid = 0.0;
  puVar4 = (undefined8 *)operator_new(0x28);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_00104d28;
  puVar4[2] = dVar2 + dVar5;
  puVar4[3] = dVar5 + dVar3;
  puVar4[4] = dVar1 * 0.5;
  this->yMid = (double)puVar4;
  this->xMid = (double)(puVar4 + 2);
  sVar6.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Quad>)sVar6.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quad> Quad::firstQuad() {
    return std::make_shared<Quad>(this->xMid + this->length / 4.0, this->yMid + this->length / 4.0, this->length / 2.0);
}